

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_create(char *zipname,char **filenames,size_t len)

{
  char cVar1;
  char *__file;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  mz_bool mVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char *pArchive_name;
  char *pcVar10;
  size_t sVar11;
  mz_zip_archive zip_archive;
  stat file_stat;
  
  iVar9 = -0x16;
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    zip_archive.m_pIO_opaque = (void *)0x0;
    zip_archive.m_pState = (mz_zip_internal_state *)0x0;
    zip_archive.m_pWrite = (mz_file_write_func)0x0;
    zip_archive.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    zip_archive.m_pAlloc_opaque = (void *)0x0;
    zip_archive.m_pRead = (mz_file_read_func)0x0;
    zip_archive.m_pFree = (mz_free_func)0x0;
    zip_archive.m_pRealloc = (mz_realloc_func)0x0;
    zip_archive.m_file_offset_alignment = 0;
    zip_archive.m_pAlloc = (mz_alloc_func)0x0;
    zip_archive.m_total_files = 0;
    zip_archive.m_zip_mode = MZ_ZIP_MODE_INVALID;
    zip_archive.m_zip_type = MZ_ZIP_TYPE_INVALID;
    zip_archive.m_last_error = MZ_ZIP_NO_ERROR;
    zip_archive.m_archive_size = 0;
    zip_archive.m_central_directory_file_ofs = 0;
    mVar5 = mz_zip_writer_init_file(&zip_archive,zipname,0);
    if (mVar5 == 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = 0;
      memset(&file_stat,0,0x90);
      sVar11 = 0;
      do {
        if (sVar11 == len) goto LAB_0010fc76;
        __file = filenames[sVar11];
        if (__file == (char *)0x0) {
          iVar9 = -2;
          goto LAB_0010fc76;
        }
        iVar6 = stat(__file,(stat *)&file_stat);
        if (iVar6 != 0) break;
        uVar8 = file_stat.st_mode & 0xf000;
        uVar7 = file_stat.st_mode & 0xfff;
        if (uVar8 == 0x4000) {
          uVar7 = file_stat.st_mode;
        }
        uVar2 = uVar7 | 0xffff8000;
        if (uVar8 != 0x8000) {
          uVar2 = uVar7;
        }
        uVar7 = uVar2 | 0xffffa000;
        if (uVar8 != 0xa000) {
          uVar7 = uVar2;
        }
        uVar2 = uVar7 | 0x6000;
        if (uVar8 != 0x6000) {
          uVar2 = uVar7;
        }
        uVar7 = uVar2 | 0x2000;
        if (uVar8 != 0x2000) {
          uVar7 = uVar2;
        }
        uVar2 = uVar7 | 0x1000;
        if (uVar8 != 0x1000) {
          uVar2 = uVar7;
        }
        uVar7 = uVar2 | 0xffffc000;
        if (uVar8 != 0xc000) {
          uVar7 = uVar2;
        }
        uVar7 = (file_stat.st_mode >> 7 & 1 | uVar7 << 0x10) ^ 1;
        bVar4 = true;
        pcVar10 = __file;
        pcVar3 = __file;
        while( true ) {
          do {
            do {
              pArchive_name = pcVar10;
              pcVar10 = pcVar3 + 1;
              cVar1 = *pcVar3;
              pcVar3 = pcVar10;
            } while (cVar1 == '/');
          } while (cVar1 == '\\');
          if (cVar1 == '\0') break;
          bVar4 = false;
          pcVar10 = pArchive_name;
        }
        if (uVar8 == 0x4000) {
          uVar7 = uVar7 + 0x10;
        }
        if (*pArchive_name == '\0') {
          if (*__file == '/') {
            if (bVar4) {
LAB_0010fc29:
              pArchive_name = pArchive_name + -1;
            }
          }
          else if (*__file == '\\' && bVar4) goto LAB_0010fc29;
        }
        mVar5 = mz_zip_writer_add_file(&zip_archive,pArchive_name,__file,"",0,6,uVar7);
        sVar11 = sVar11 + 1;
      } while (mVar5 != 0);
      iVar9 = -0x13;
LAB_0010fc76:
      mz_zip_writer_finalize_archive(&zip_archive);
      mz_zip_writer_end(&zip_archive);
    }
  }
  return iVar9;
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int err = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;
  mz_uint16 modes;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return ZIP_EINVZIPNAME;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return ZIP_ENOINIT;
  }

  if (!memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT))) {
    return ZIP_EMEMSET;
  }

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      err = ZIP_EINVENTNAME;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      err = ZIP_ENOFILE;
      break;
    }

#if defined(_WIN32) || defined(__WIN32__) || defined(DJGPP)
    (void)modes; // unused
#else

    /* Initialize with permission bits--which are not implementation-optional */
    modes = file_stat.st_mode &
            (S_IRWXU | S_IRWXG | S_IRWXO | S_ISUID | S_ISGID | S_ISVTX);
    if (S_ISDIR(file_stat.st_mode))
      modes |= UNX_IFDIR;
    if (S_ISREG(file_stat.st_mode))
      modes |= UNX_IFREG;
    if (S_ISLNK(file_stat.st_mode))
      modes |= UNX_IFLNK;
    if (S_ISBLK(file_stat.st_mode))
      modes |= UNX_IFBLK;
    if (S_ISCHR(file_stat.st_mode))
      modes |= UNX_IFCHR;
    if (S_ISFIFO(file_stat.st_mode))
      modes |= UNX_IFIFO;
    if (S_ISSOCK(file_stat.st_mode))
      modes |= UNX_IFSOCK;
    ext_attributes = (modes << 16) | !(file_stat.st_mode & S_IWUSR);
    if ((file_stat.st_mode & S_IFMT) == S_IFDIR) {
      ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
    }
#endif

    if (!mz_zip_writer_add_file(&zip_archive, zip_basename(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      err = ZIP_ENOFILE;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return err;
}